

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O0

GNB * __thiscall GNB::predict_abi_cxx11_(GNB *this,vector<double,_std::allocator<double>_> *sample)

{
  const_reference pvVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RDX;
  __type _Var3;
  __type _Var4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double prob_right;
  double prob_keep;
  double prob_left;
  double prob_s;
  vector<double,_std::allocator<double>_> *sample_local;
  GNB *this_local;
  
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_left_s,2);
  _Var4 = std::pow<double,int>(stddev_left_s,2);
  dVar5 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_left_s,2);
  dVar6 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,1);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_left_d,2);
  _Var4 = std::pow<double,int>(stddev_left_d,2);
  dVar7 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_left_s,2);
  dVar8 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,2);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_left_s_dot,2);
  _Var4 = std::pow<double,int>(stddev_left_s_dot,2);
  dVar9 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_left_s_dot,2);
  dVar10 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,3);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_left_d_dot,2);
  _Var4 = std::pow<double,int>(stddev_left_d_dot,2);
  dVar11 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_left_d_dot,2);
  dVar12 = sqrt(_Var3 * 6.283185307179586);
  dVar5 = p_left * (dVar11 / dVar12) * (dVar9 / dVar10) * (dVar7 / dVar8) * (dVar5 / dVar6) * 1.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_keep_s,2);
  _Var4 = std::pow<double,int>(stddev_keep_s,2);
  dVar6 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_keep_s,2);
  dVar7 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,1);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_keep_d,2);
  _Var4 = std::pow<double,int>(stddev_keep_d,2);
  dVar8 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_keep_s,2);
  dVar9 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,2);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_keep_s_dot,2);
  _Var4 = std::pow<double,int>(stddev_keep_s_dot,2);
  dVar10 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_keep_s_dot,2);
  dVar11 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,3);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_keep_d_dot,2);
  _Var4 = std::pow<double,int>(stddev_keep_d_dot,2);
  dVar12 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_keep_d_dot,2);
  dVar13 = sqrt(_Var3 * 6.283185307179586);
  dVar6 = p_keep * (dVar12 / dVar13) * (dVar10 / dVar11) * (dVar8 / dVar9) * (dVar6 / dVar7) * 1.0;
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_right_s,2);
  _Var4 = std::pow<double,int>(stddev_right_s,2);
  dVar7 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_right_s,2);
  dVar8 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,1);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_right_d,2);
  _Var4 = std::pow<double,int>(stddev_right_d,2);
  dVar9 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_right_s,2);
  dVar10 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,2);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_right_s_dot,2);
  _Var4 = std::pow<double,int>(stddev_right_s_dot,2);
  dVar11 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_right_s_dot,2);
  dVar12 = sqrt(_Var3 * 6.283185307179586);
  pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,3);
  _Var3 = std::pow<double,int>(*pvVar1 - mean_right_d_dot,2);
  _Var4 = std::pow<double,int>(stddev_right_d_dot,2);
  dVar13 = exp((_Var3 * -1.0) / (_Var4 * 2.0));
  _Var3 = std::pow<double,int>(stddev_right_d_dot,2);
  dVar14 = sqrt(_Var3 * 6.283185307179586);
  if (dVar5 < p_right * (dVar13 / dVar14) *
                        (dVar11 / dVar12) * (dVar9 / dVar10) * (dVar7 / dVar8) * 1.0) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish,1);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
  }
  else if (dVar5 < dVar6) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish,1);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
  }
  else {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&(sample->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                              super__Vector_impl_data._M_finish,0);
    std::__cxx11::string::string((string *)this,(string *)pvVar2);
  }
  return this;
}

Assistant:

string GNB::predict(const vector<double> &sample)
{
  /**
   * Once trained, this method is called and expected to return 
   *   a predicted behavior for the given observation.
   * @param observation - a 4 tuple with s, d, s_dot, d_dot.
   *   - Example: [3.5, 0.1, 8.5, -0.2]
   * @output A label representing the best guess of the classifier. Can
   *   be one of "left", "keep" or "right".
   *
   * TODO: Complete this function to return your classifier's prediction
   */
  double prob_s;
  double prob_left = 1;
  double prob_keep = 1;
  double prob_right = 1;

  // prob of s being left * prob of d being left * prob of sdot being left * prob of ddot being left
  // prob of s being keep * prob of d being keep * prob of sdot being keep * prob of ddot being keep
  // prob of s being right * prob of d being right * prob of sdot being right * prob of ddot being right
  // Once you have all these probs, find the max one out of them.

  // prob of being left
  prob_s = exp(-1 * pow(sample[0] - mean_left_s, 2) / (2 * pow(stddev_left_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_left_d, 2) / (2 * pow(stddev_left_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_left_s_dot, 2) / (2 * pow(stddev_left_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_s_dot, 2));
  prob_left *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_left_d_dot, 2) / (2 * pow(stddev_left_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_left_d_dot, 2));
  prob_left *= prob_s;
  prob_left *= p_left;

  // prob of being keep
  prob_s = exp(-1 * pow(sample[0] - mean_keep_s, 2) / (2 * pow(stddev_keep_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_keep_d, 2) / (2 * pow(stddev_keep_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_keep_s_dot, 2) / (2 * pow(stddev_keep_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_s_dot, 2));
  prob_keep *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_keep_d_dot, 2) / (2 * pow(stddev_keep_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_keep_d_dot, 2));
  prob_keep *= prob_s;
  prob_keep *= p_keep;

  // prob of being right
  prob_s = exp(-1 * pow(sample[0] - mean_right_s, 2) / (2 * pow(stddev_right_s, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[1] - mean_right_d, 2) / (2 * pow(stddev_right_d, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[2] - mean_right_s_dot, 2) / (2 * pow(stddev_right_s_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_s_dot, 2));
  prob_right *= prob_s;

  prob_s = exp(-1 * pow(sample[3] - mean_right_d_dot, 2) / (2 * pow(stddev_right_d_dot, 2)));
  prob_s = prob_s / sqrt(2 * M_PI * pow(stddev_right_d_dot, 2));
  prob_right *= prob_s;
  prob_right *= p_right;

  if (prob_left >= prob_right)
  {
    if (prob_left >= prob_keep)
    {
      return this->possible_labels[0];
    }
    else
    {
      return this->possible_labels[1];
    }
  }
  else
  {
    return this->possible_labels[1];
  }
}